

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O1

matd_svd_t * matd_svd_flags(matd_svd_t *__return_storage_ptr__,matd_t *A,int flags)

{
  matd_t *A_00;
  matd_t *pmVar1;
  matd_svd_t tmp;
  matd_svd_t local_40;
  
  if (A->nrows < A->ncols) {
    A_00 = matd_transpose(A);
    matd_svd_tall(&local_40,A_00,flags);
    __return_storage_ptr__->U = (matd_t *)0x0;
    __return_storage_ptr__->S = (matd_t *)0x0;
    __return_storage_ptr__->V = (matd_t *)0x0;
    __return_storage_ptr__->U = local_40.V;
    pmVar1 = matd_transpose(local_40.S);
    __return_storage_ptr__->S = pmVar1;
    __return_storage_ptr__->V = local_40.U;
    if (local_40.S != (matd_t *)0x0) {
      free(local_40.S);
    }
    if (A_00 != (matd_t *)0x0) {
      free(A_00);
    }
  }
  else {
    matd_svd_tall(__return_storage_ptr__,A,flags);
  }
  return __return_storage_ptr__;
}

Assistant:

matd_svd_t matd_svd_flags(matd_t *A, int flags)
{
    matd_svd_t res;

    if (A->ncols <= A->nrows) {
        res = matd_svd_tall(A, flags);
    } else {
        matd_t *At = matd_transpose(A);

        // A =U  S  V'
        // A'=V  S' U'

        matd_svd_t tmp = matd_svd_tall(At, flags);

        memset(&res, 0, sizeof(res));
        res.U = tmp.V; //matd_transpose(tmp.V);
        res.S = matd_transpose(tmp.S);
        res.V = tmp.U; //matd_transpose(tmp.U);

        matd_destroy(tmp.S);
        matd_destroy(At);
    }

/*
  matd_t *check = matd_op("M*M*M'-M", res.U, res.S, res.V, A);
  double maxerr = 0;

  for (int i = 0; i < check->nrows; i++)
  for (int j = 0; j < check->ncols; j++)
  maxerr = fmax(maxerr, fabs(MATD_EL(check, i, j)));

  matd_destroy(check);

  if (maxerr > 1e-7) {
  printf("bad maxerr: %15f\n", maxerr);
  }

  if (maxerr > 1e-5) {
  printf("bad maxerr: %15f\n", maxerr);
  matd_print(A, "%15f");
  assert(0);
  }

*/
    return res;
}